

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

void Gia_ObjCollectInternalCut(Gia_Man_t *p,int iRoot,Vec_Int_t *vLeaves)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if (-1 < iRoot) {
    pVVar1 = p->vTtNums;
    if (iRoot < pVVar1->nSize) {
      piVar2 = pVVar1->pArray;
      if (-1000000000 < piVar2[(uint)iRoot]) {
        __assert_fail("!Gia_ObjHasNumId(p, iRoot)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                      ,0x14b,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
      }
      if (p->nObjs <= iRoot) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar4 = (uint)*(undefined8 *)(p->pObjs + (uint)iRoot);
      if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iRoot))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                      ,0x14c,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
      }
      if (0 < vLeaves->nSize) {
        piVar3 = vLeaves->pArray;
        iVar5 = 0;
        lVar6 = 0;
        do {
          lVar7 = (long)piVar3[lVar6];
          if ((lVar7 < 0) || (pVVar1->nSize <= piVar3[lVar6])) goto LAB_00739ebb;
          if (-1000000000 < piVar2[lVar7]) {
            __assert_fail("!Gia_ObjHasNumId(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                          ,0x14f,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
          }
          piVar2[lVar7] = iVar5;
          lVar6 = lVar6 + 1;
          iVar5 = iVar5 + -1;
        } while (lVar6 < vLeaves->nSize);
      }
      if (iRoot < pVVar1->nSize) {
        if (piVar2[(uint)iRoot] < -999999999) {
          pVVar1 = p->vTtNodes;
          pVVar1->nSize = 0;
          Vec_IntPush(pVVar1,-1);
          Gia_ObjCollectInternalCut_rec(p,iRoot);
          return;
        }
        __assert_fail("!Gia_ObjHasNumId(p, iRoot)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                      ,0x152,"void Gia_ObjCollectInternalCut(Gia_Man_t *, int, Vec_Int_t *)");
      }
    }
  }
LAB_00739ebb:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ObjCollectInternalCut( Gia_Man_t * p, int iRoot, Vec_Int_t * vLeaves )
{
    int i, iObj;
    assert( !Gia_ObjHasNumId(p, iRoot) );
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iRoot)) );
    Vec_IntForEachEntry( vLeaves, iObj, i )
    {
        assert( !Gia_ObjHasNumId(p, iObj) );
        Gia_ObjSetNumId( p, iObj, -i );
    }
    assert( !Gia_ObjHasNumId(p, iRoot) ); // the root cannot be one of the leaves
    Vec_IntClear( p->vTtNodes );
    Vec_IntPush( p->vTtNodes, -1 );
    Gia_ObjCollectInternalCut_rec( p, iRoot );
}